

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

TextureFormat deqp::gles2::Functional::mapGLUnsizedInternalFormat(deUint32 internalFormat)

{
  InternalError *this;
  long *plVar1;
  size_type *psVar2;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (internalFormat - 0x1906 < 5) {
    return *(TextureFormat *)(&DAT_01c05a78 + (ulong)(internalFormat - 0x1906) * 8);
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Can\'t map GL unsized internal format (","");
  local_70 = (ulong)internalFormat;
  tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_68,&local_70);
  std::operator+(&local_48,&local_90,&local_68);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_b0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar2) {
    local_b0.field_2._M_allocated_capacity = *psVar2;
    local_b0.field_2._8_8_ = plVar1[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar2;
  }
  local_b0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  tcu::InternalError::InternalError(this,&local_b0);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TextureFormat mapGLUnsizedInternalFormat (deUint32 internalFormat)
{
	using tcu::TextureFormat;
	switch (internalFormat)
	{
		case GL_ALPHA:				return TextureFormat(TextureFormat::A,		TextureFormat::UNORM_INT8);
		case GL_LUMINANCE:			return TextureFormat(TextureFormat::L,		TextureFormat::UNORM_INT8);
		case GL_LUMINANCE_ALPHA:	return TextureFormat(TextureFormat::LA,		TextureFormat::UNORM_INT8);
		case GL_RGB:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
		case GL_RGBA:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
		default:
			throw tcu::InternalError(string("Can't map GL unsized internal format (") + tcu::toHex(internalFormat).toString() + ") to texture format");
	}
}